

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int h264_slice_data(bitstream *str,h264_slice *slice)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  int more_1;
  uint32_t first_addr_1;
  int more;
  uint32_t mb_skip_run;
  int end;
  uint32_t end_of_slice_flag;
  uint32_t first_addr;
  int ival;
  int save;
  uint32_t mb_skip_flag;
  h264_cabac_context *cabac;
  h264_slice *phStack_20;
  uint32_t skip_type;
  h264_slice *slice_local;
  bitstream *str_local;
  
  slice->prev_mb_addr = 0xffffffff;
  slice->curr_mb_addr = slice->first_mb_in_slice * (slice->mbaff_frame_flag + 1);
  if (str->dir == VS_DECODE) {
    slice->last_mb_in_slice = slice->curr_mb_addr;
  }
  cabac._4_4_ = 0x20;
  if (slice->slice_type == 1) {
    cabac._4_4_ = 0x38;
  }
  phStack_20 = slice;
  slice_local = (h264_slice *)str;
  if (slice->picparm->entropy_coding_mode_flag == 0) {
    do {
      more = 0;
      first_addr_1 = 0;
      if ((phStack_20->slice_type != 2) && (phStack_20->slice_type != 4)) {
        if (slice_local->nal_ref_idc == 0) {
          first_addr_1 = 0;
          while (phStack_20->mbs[phStack_20->curr_mb_addr].mb_type == cabac._4_4_) {
            first_addr_1 = first_addr_1 + 1;
            iVar1 = infer_skip((bitstream *)slice_local,phStack_20,
                               phStack_20->mbs + phStack_20->curr_mb_addr);
            if (iVar1 != 0) {
              return 1;
            }
            if (phStack_20->curr_mb_addr == phStack_20->last_mb_in_slice) {
              more = 1;
              break;
            }
            phStack_20->prev_mb_addr = phStack_20->curr_mb_addr;
            uVar2 = h264_next_mb_addr(phStack_20,phStack_20->curr_mb_addr);
            phStack_20->curr_mb_addr = uVar2;
          }
          iVar1 = vs_ue((bitstream *)slice_local,&first_addr_1);
          if (iVar1 != 0) {
            return 1;
          }
          if (more != 0) goto LAB_00107bba;
        }
        else {
          iVar1 = vs_ue((bitstream *)slice_local,&first_addr_1);
          if (iVar1 != 0) {
            return 1;
          }
          while (uVar2 = first_addr_1 - 1, first_addr_1 != 0) {
            if (phStack_20->pic_size_in_mbs <= phStack_20->curr_mb_addr) {
              first_addr_1 = uVar2;
              fprintf(_stderr,"MB index out of range!\n");
              return 1;
            }
            phStack_20->last_mb_in_slice = phStack_20->curr_mb_addr;
            phStack_20->mbs[phStack_20->curr_mb_addr].mb_type = cabac._4_4_;
            first_addr_1 = uVar2;
            iVar1 = infer_skip((bitstream *)slice_local,phStack_20,
                               phStack_20->mbs + phStack_20->curr_mb_addr);
            if (iVar1 != 0) {
              return 1;
            }
            phStack_20->prev_mb_addr = phStack_20->curr_mb_addr;
            phStack_20->last_mb_in_slice = phStack_20->curr_mb_addr;
            uVar2 = h264_next_mb_addr(phStack_20,phStack_20->curr_mb_addr);
            phStack_20->curr_mb_addr = uVar2;
          }
          first_addr_1 = uVar2;
          iVar1 = vs_has_more_data((bitstream *)slice_local);
          if (iVar1 == -1) {
            return 1;
          }
          if (iVar1 == 0) goto LAB_00107bba;
        }
      }
      if (phStack_20->pic_size_in_mbs <= phStack_20->curr_mb_addr) {
        fprintf(_stderr,"MB index out of range!\n");
        return 1;
      }
      if (phStack_20->mbaff_frame_flag == 0) {
        iVar1 = vs_infer((bitstream *)slice_local,
                         &phStack_20->mbs[phStack_20->curr_mb_addr].mb_field_decoding_flag,
                         phStack_20->field_pic_flag);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        uVar3 = phStack_20->curr_mb_addr & 0xfffffffe;
        if (phStack_20->curr_mb_addr == uVar3) {
          iVar1 = h264_mb_field_decoding_flag
                            ((bitstream *)slice_local,(h264_cabac_context *)0x0,
                             &phStack_20->mbs[uVar3].mb_field_decoding_flag);
          if (iVar1 != 0) {
            return 1;
          }
        }
        else {
          if ((phStack_20->mbs[uVar3].mb_type == cabac._4_4_) &&
             (iVar1 = h264_mb_field_decoding_flag
                                ((bitstream *)slice_local,(h264_cabac_context *)0x0,
                                 &phStack_20->mbs[uVar3].mb_field_decoding_flag), iVar1 != 0)) {
            return 1;
          }
          iVar1 = vs_infer((bitstream *)slice_local,
                           &phStack_20->mbs[uVar3 + 1].mb_field_decoding_flag,
                           phStack_20->mbs[uVar3].mb_field_decoding_flag);
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
      iVar1 = h264_macroblock_layer
                        ((bitstream *)slice_local,(h264_cabac_context *)0x0,phStack_20,
                         phStack_20->mbs + phStack_20->curr_mb_addr);
      if (iVar1 != 0) {
        return 1;
      }
      if (slice_local->nal_ref_idc == 0) {
        if (phStack_20->last_mb_in_slice == phStack_20->curr_mb_addr) {
LAB_00107bba:
          iVar1 = vs_end((bitstream *)slice_local);
          if (iVar1 == 0) {
            return 0;
          }
          return 1;
        }
      }
      else {
        phStack_20->last_mb_in_slice = phStack_20->curr_mb_addr;
        iVar1 = vs_has_more_data((bitstream *)slice_local);
        if (iVar1 == -1) {
          return 1;
        }
        if (iVar1 == 0) goto LAB_00107bba;
      }
      phStack_20->prev_mb_addr = phStack_20->curr_mb_addr;
      if (slice_local->nal_ref_idc == 1) {
        phStack_20->last_mb_in_slice = phStack_20->curr_mb_addr;
      }
      uVar2 = h264_next_mb_addr(phStack_20,phStack_20->curr_mb_addr);
      phStack_20->curr_mb_addr = uVar2;
    } while (phStack_20->curr_mb_addr < phStack_20->pic_size_in_mbs);
    fprintf(_stderr,"MB index out of range!\n");
  }
  else {
    iVar1 = vs_align_byte(str,VS_ALIGN_1);
    if (iVar1 == 0) {
      _save = h264_cabac_new(phStack_20);
      iVar1 = h264_cabac_init_arith((bitstream *)slice_local,_save);
      if (iVar1 == 0) {
        do {
          ival = 0;
          if ((phStack_20->slice_type != 2) && (phStack_20->slice_type != 4)) {
            if (slice_local->nal_ref_idc == 0) {
              ival = (int)(phStack_20->mbs[phStack_20->curr_mb_addr].mb_type == cabac._4_4_);
            }
            first_addr = phStack_20->mbs[phStack_20->curr_mb_addr].mb_field_decoding_flag;
            if (((phStack_20->mbaff_frame_flag == 0) || ((phStack_20->curr_mb_addr & 1) == 0)) ||
               (phStack_20->mbs[phStack_20->curr_mb_addr - 1].mb_type == cabac._4_4_)) {
              end_of_slice_flag = inferred_mb_field_decoding_flag(phStack_20);
            }
            else {
              end_of_slice_flag =
                   phStack_20->mbs[phStack_20->curr_mb_addr - 1].mb_field_decoding_flag;
            }
            phStack_20->mbs[phStack_20->curr_mb_addr].mb_field_decoding_flag = end_of_slice_flag;
            iVar1 = h264_mb_skip_flag((bitstream *)slice_local,_save,(uint32_t *)&ival);
            if (iVar1 != 0) {
              h264_cabac_destroy(_save);
              return 1;
            }
            phStack_20->mbs[phStack_20->curr_mb_addr].mb_field_decoding_flag = first_addr;
          }
          if (ival == 0) {
            if (phStack_20->mbaff_frame_flag == 0) {
              iVar1 = vs_infer((bitstream *)slice_local,
                               &phStack_20->mbs[phStack_20->curr_mb_addr].mb_field_decoding_flag,
                               phStack_20->field_pic_flag);
              if (iVar1 != 0) {
                h264_cabac_destroy(_save);
                return 1;
              }
            }
            else {
              end = phStack_20->curr_mb_addr & 0xfffffffe;
              if (phStack_20->curr_mb_addr == end) {
                iVar1 = h264_mb_field_decoding_flag
                                  ((bitstream *)slice_local,_save,
                                   &phStack_20->mbs[(uint)end].mb_field_decoding_flag);
                if (iVar1 != 0) {
                  h264_cabac_destroy(_save);
                  return 1;
                }
              }
              else {
                if ((phStack_20->mbs[(uint)end].mb_type == cabac._4_4_) &&
                   (iVar1 = h264_mb_field_decoding_flag
                                      ((bitstream *)slice_local,_save,
                                       &phStack_20->mbs[(uint)end].mb_field_decoding_flag),
                   iVar1 != 0)) {
                  h264_cabac_destroy(_save);
                  return 1;
                }
                iVar1 = vs_infer((bitstream *)slice_local,
                                 &phStack_20->mbs[end + 1].mb_field_decoding_flag,
                                 phStack_20->mbs[(uint)end].mb_field_decoding_flag);
                if (iVar1 != 0) {
                  h264_cabac_destroy(_save);
                  return 1;
                }
              }
            }
            iVar1 = h264_macroblock_layer
                              ((bitstream *)slice_local,_save,phStack_20,
                               phStack_20->mbs + phStack_20->curr_mb_addr);
            if (iVar1 != 0) {
              h264_cabac_destroy(_save);
              return 1;
            }
          }
          else {
            iVar1 = infer_skip((bitstream *)slice_local,phStack_20,
                               phStack_20->mbs + phStack_20->curr_mb_addr);
            if (iVar1 != 0) {
              h264_cabac_destroy(_save);
              return 1;
            }
          }
          if ((phStack_20->mbaff_frame_flag == 0) || ((phStack_20->curr_mb_addr & 1) != 0)) {
            mb_skip_run = (uint32_t)(phStack_20->last_mb_in_slice == phStack_20->curr_mb_addr);
            iVar1 = h264_cabac_terminate((bitstream *)slice_local,_save,&mb_skip_run);
            if (iVar1 != 0) {
              h264_cabac_destroy(_save);
              return 1;
            }
            if (mb_skip_run != 0) {
              phStack_20->last_mb_in_slice = phStack_20->curr_mb_addr;
              h264_cabac_destroy(_save);
              iVar1 = vs_align_byte((bitstream *)slice_local,VS_ALIGN_0);
              return iVar1;
            }
          }
          phStack_20->prev_mb_addr = phStack_20->curr_mb_addr;
          if (slice_local->nal_ref_idc == 1) {
            phStack_20->last_mb_in_slice = phStack_20->curr_mb_addr;
          }
          uVar2 = h264_next_mb_addr(phStack_20,phStack_20->curr_mb_addr);
          phStack_20->curr_mb_addr = uVar2;
        } while (phStack_20->curr_mb_addr < phStack_20->pic_size_in_mbs);
        fprintf(_stderr,"MB index out of range!\n");
      }
      else {
        h264_cabac_destroy(_save);
      }
    }
  }
  return 1;
}

Assistant:

int h264_slice_data(struct bitstream *str, struct h264_slice *slice) {
	slice->prev_mb_addr = -1;
	slice->curr_mb_addr = slice->first_mb_in_slice * (1 + slice->mbaff_frame_flag);
	if (str->dir == VS_DECODE)
		slice->last_mb_in_slice = slice->curr_mb_addr;
	uint32_t skip_type = (slice->slice_type == H264_SLICE_TYPE_B ? H264_MB_TYPE_B_SKIP : H264_MB_TYPE_P_SKIP);
	if (slice->picparm->entropy_coding_mode_flag) {
		if (vs_align_byte(str, VS_ALIGN_1)) return 1;
		struct h264_cabac_context *cabac = h264_cabac_new(slice);
		if (h264_cabac_init_arith(str, cabac)) { h264_cabac_destroy(cabac); return 1; }
		while (1) {
			uint32_t mb_skip_flag = 0;
			if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
				if (str->dir == VS_ENCODE) {
					mb_skip_flag = slice->mbs[slice->curr_mb_addr].mb_type == skip_type;
				}
				/* mb_field_decoding_flag is decoded *after* mb_skip_flag in some circumstances, have to use an inferred value for CABAC prediction */
				int save = slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag;
				int ival;
				if (slice->mbaff_frame_flag
						&& slice->curr_mb_addr & 1
						&& slice->mbs[slice->curr_mb_addr - 1].mb_type != skip_type) {
					ival = slice->mbs[slice->curr_mb_addr - 1].mb_field_decoding_flag;
				} else {
					ival = inferred_mb_field_decoding_flag(slice);
				}
				slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = ival;
				if (h264_mb_skip_flag(str, cabac, &mb_skip_flag)) { h264_cabac_destroy(cabac); return 1; }
				slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = save;
			}
			if (mb_skip_flag) {
				if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) { h264_cabac_destroy(cabac); return 1; }
			} else {
				if (slice->mbaff_frame_flag) {
					uint32_t first_addr = slice->curr_mb_addr & ~1;
					if (slice->curr_mb_addr == first_addr) {
						if (h264_mb_field_decoding_flag(str, cabac, &slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
					} else {
						if (slice->mbs[first_addr].mb_type == skip_type) {
							if (h264_mb_field_decoding_flag(str, cabac, &slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
						}
						if (vs_infer(str, &slice->mbs[first_addr + 1].mb_field_decoding_flag, slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
					}
				} else {
					if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) { h264_cabac_destroy(cabac); return 1; }
				}
				if (h264_macroblock_layer(str, cabac, slice, &slice->mbs[slice->curr_mb_addr])) { h264_cabac_destroy(cabac); return 1; }
			}
			if (!slice->mbaff_frame_flag || (slice->curr_mb_addr & 1)) {
				uint32_t end_of_slice_flag = slice->last_mb_in_slice == slice->curr_mb_addr;
				if (h264_cabac_terminate(str, cabac, &end_of_slice_flag)) { h264_cabac_destroy(cabac); return 1; }
				if (end_of_slice_flag) {
					slice->last_mb_in_slice = slice->curr_mb_addr;
					h264_cabac_destroy(cabac);
					/* XXX: cabac_zero_word crap */
					return vs_align_byte(str, VS_ALIGN_0);
				}
			}
			slice->prev_mb_addr = slice->curr_mb_addr;
			if (str->dir == VS_DECODE)
				slice->last_mb_in_slice = slice->curr_mb_addr;
			slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
		}
	} else {
		while (1) {
			int end = 0;
			uint32_t mb_skip_run = 0;
			if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
				if (str->dir == VS_ENCODE) {
					mb_skip_run = 0;
					while (slice->mbs[slice->curr_mb_addr].mb_type == skip_type) {
						mb_skip_run++;
						if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
						if (slice->curr_mb_addr == slice->last_mb_in_slice) {
							end = 1;
							break;
						}
						slice->prev_mb_addr = slice->curr_mb_addr;
						slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
					}
					if (vs_ue(str, &mb_skip_run)) return 1;
					if (end)
						goto out_cavlc;
				} else {
					if (vs_ue(str, &mb_skip_run)) return 1;
					while (mb_skip_run--) {
						if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
							fprintf(stderr, "MB index out of range!\n");
							return 1;
						}
						slice->last_mb_in_slice = slice->curr_mb_addr;
						slice->mbs[slice->curr_mb_addr].mb_type = skip_type;
						if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
						slice->prev_mb_addr = slice->curr_mb_addr;
						slice->last_mb_in_slice = slice->curr_mb_addr;
						slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
					}
					int more = vs_has_more_data(str);
					if (more == -1)
						return 1;
					if (more == 0)
						goto out_cavlc;
				}
			}
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
			if (slice->mbaff_frame_flag) {
				uint32_t first_addr = slice->curr_mb_addr & ~1;
				if (slice->curr_mb_addr == first_addr) {
					if (h264_mb_field_decoding_flag(str, 0, &slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
				} else {
					if (slice->mbs[first_addr].mb_type == skip_type)
						if (h264_mb_field_decoding_flag(str, 0, &slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
					if (vs_infer(str, &slice->mbs[first_addr + 1].mb_field_decoding_flag, slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
				}
			} else {
				if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) return 1;
			}
			if (h264_macroblock_layer(str, 0, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
			if(str->dir == VS_ENCODE) {
				if (slice->last_mb_in_slice == slice->curr_mb_addr)
					goto out_cavlc;
			} else {
				slice->last_mb_in_slice = slice->curr_mb_addr;
				int more = vs_has_more_data(str);
				if (more == -1)
					return 1;
				if (more == 0)
					goto out_cavlc;
			}
			slice->prev_mb_addr = slice->curr_mb_addr;
			if (str->dir == VS_DECODE)
				slice->last_mb_in_slice = slice->curr_mb_addr;
			slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
		}
out_cavlc:
		if (vs_end(str)) return 1;
		return 0;
	}
}